

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O2

FabSet * __thiscall
amrex::FabSet::linComb
          (FabSet *this,Real a,MultiFab *mfa,int a_comp,Real b,MultiFab *mfb,int b_comp,int dcomp,
          int ncomp,int ngrow)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  Periodicity *pPVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  Array4<double> afab;
  Array4<double> bfab;
  Array4<double> dfab;
  MFIter mfi;
  MultiFab bdryb;
  MultiFab bdrya;
  long local_4f8;
  long local_4f0;
  Array4<double> local_490;
  FabArray<amrex::FArrayBox> *local_450;
  FabArray<amrex::FArrayBox> *local_448;
  Real local_440;
  Real local_438;
  Array4<double> local_430;
  Box local_3ec;
  Array4<double> local_3d0;
  undefined1 local_390 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_380;
  int local_368;
  undefined1 local_330 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_320 [15];
  FabArray<amrex::FArrayBox> local_1b0;
  
  bxs = &(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray;
  dm = &(this->m_mf).super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap;
  local_330._0_8_ = (_func_int **)0x1;
  local_330._8_8_ = (Arena *)0x0;
  avStack_320[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_320[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_320[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_390._0_8_ = &PTR__FabFactory_006d8928;
  local_450 = &mfb->super_FabArray<amrex::FArrayBox>;
  local_448 = &mfa->super_FabArray<amrex::FArrayBox>;
  local_440 = a;
  local_438 = b;
  MultiFab::MultiFab((MultiFab *)&local_1b0,bxs,dm,ncomp,0,(MFInfo *)local_330,
                     (FabFactory<amrex::FArrayBox> *)local_390);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(avStack_320);
  local_390._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  local_390._8_8_ = (FabArrayBase *)0x0;
  vStack_380.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_380.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_380.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_490.p = (double *)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab((MultiFab *)local_330,bxs,dm,ncomp,0,(MFInfo *)local_390,
                     (FabFactory<amrex::FArrayBox> *)&local_490);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vStack_380);
  uVar4 = 0;
  MFIter::MFIter((MFIter *)local_390,&local_1b0.super_FabArrayBase,'\0');
  if (0 < ncomp) {
    uVar4 = (ulong)(uint)ncomp;
  }
  while ((int)vStack_380.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage < local_368) {
    MFIter::validbox((Box *)&local_3d0,(MFIter *)local_390);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_490,&local_1b0,(MFIter *)local_390);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_430,(FabArray<amrex::FArrayBox> *)local_330,(MFIter *)local_390);
    lVar2 = (long)local_3d0.p._4_4_;
    local_4f8 = 0;
    for (uVar3 = 0; lVar7 = (long)(int)local_3d0.jstride, uVar3 != uVar4; uVar3 = uVar3 + 1) {
      for (; (int)lVar7 <= local_3d0.kstride._4_4_; lVar7 = lVar7 + 1) {
        lVar10 = (long)local_430.p +
                 local_430.nstride * local_4f8 +
                 (lVar2 - local_430.begin.y) * local_430.jstride * 8 +
                 (lVar7 - local_430.begin.z) * local_430.kstride * 8 + (long)local_430.begin.x * -8
                 + (long)(int)local_3d0.p * 8;
        lVar9 = (long)local_490.p +
                local_490.nstride * local_4f8 +
                (lVar2 - local_490.begin.y) * local_490.jstride * 8 +
                (lVar7 - local_490.begin.z) * local_490.kstride * 8 + (long)local_490.begin.x * -8 +
                (long)(int)local_3d0.p * 8;
        for (lVar5 = lVar2; lVar5 <= (int)local_3d0.kstride; lVar5 = lVar5 + 1) {
          if ((int)local_3d0.p <= local_3d0.jstride._4_4_) {
            lVar6 = 0;
            do {
              *(undefined8 *)(lVar9 + lVar6 * 8) = 0x6974e718d7d7625a;
              *(undefined8 *)(lVar10 + lVar6 * 8) = 0x6974e718d7d7625a;
              lVar6 = lVar6 + 1;
            } while ((local_3d0.jstride._4_4_ - (int)local_3d0.p) + 1 != (int)lVar6);
          }
          lVar10 = lVar10 + local_430.jstride * 8;
          lVar9 = lVar9 + local_490.jstride * 8;
        }
      }
      local_4f8 = local_4f8 + 8;
    }
    MFIter::operator++((MFIter *)local_390);
  }
  MFIter::~MFIter((MFIter *)local_390);
  pPVar1 = Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy(&local_1b0,local_448,a_comp,0,ncomp,ngrow,0,pPVar1,COPY);
  pPVar1 = Periodicity::NonPeriodic();
  FabArray<amrex::FArrayBox>::ParallelCopy
            ((FabArray<amrex::FArrayBox> *)local_330,local_450,b_comp,0,ncomp,ngrow,0,pPVar1,COPY);
  FabSetIter::FabSetIter((FabSetIter *)local_390,this);
  while( true ) {
    if (local_368 <=
        (int)vStack_380.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) break;
    MFIter::validbox(&local_3ec,(MFIter *)local_390);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_490,&local_1b0,(MFIter *)local_390);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_430,(FabArray<amrex::FArrayBox> *)local_330,(MFIter *)local_390);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_3d0,(FabArray<amrex::FArrayBox> *)this,(MFIter *)local_390);
    lVar2 = (long)local_3ec.smallend.vect[1];
    lVar7 = (long)local_3ec.smallend.vect[0] * 8;
    local_4f0 = 0;
    local_4f8 = (long)dcomp << 3;
    for (uVar3 = 0; lVar5 = (long)local_3ec.smallend.vect[2], uVar3 != uVar4; uVar3 = uVar3 + 1) {
      for (; (int)lVar5 <= local_3ec.bigend.vect[2]; lVar5 = lVar5 + 1) {
        lVar10 = CONCAT44(local_3d0.jstride._4_4_,(int)local_3d0.jstride) * 8;
        lVar12 = local_3d0.nstride * local_4f8 +
                 (lVar2 - local_3d0.begin.y) * lVar10 +
                 (lVar5 - local_3d0.begin.z) *
                 CONCAT44(local_3d0.kstride._4_4_,(int)local_3d0.kstride) * 8 +
                 (long)local_3d0.begin.x * -8 + CONCAT44(local_3d0.p._4_4_,(int)local_3d0.p) + lVar7
        ;
        lVar6 = (long)local_430.p +
                local_430.nstride * local_4f0 +
                (lVar2 - local_430.begin.y) * local_430.jstride * 8 +
                (lVar5 - local_430.begin.z) * local_430.kstride * 8 + (long)local_430.begin.x * -8 +
                lVar7;
        lVar11 = (long)local_490.p +
                 local_490.nstride * local_4f0 +
                 (lVar2 - local_490.begin.y) * local_490.jstride * 8 +
                 (lVar5 - local_490.begin.z) * local_490.kstride * 8 + (long)local_490.begin.x * -8
                 + lVar7;
        for (lVar9 = lVar2; lVar9 <= local_3ec.bigend.vect[1]; lVar9 = lVar9 + 1) {
          if (local_3ec.smallend.vect[0] <= local_3ec.bigend.vect[0]) {
            lVar8 = 0;
            do {
              *(double *)(lVar12 + lVar8 * 8) =
                   *(double *)(lVar11 + lVar8 * 8) * local_440 +
                   *(double *)(lVar6 + lVar8 * 8) * local_438;
              lVar8 = lVar8 + 1;
            } while ((local_3ec.bigend.vect[0] - local_3ec.smallend.vect[0]) + 1 != (int)lVar8);
          }
          lVar12 = lVar12 + lVar10;
          lVar6 = lVar6 + local_430.jstride * 8;
          lVar11 = lVar11 + local_490.jstride * 8;
        }
      }
      local_4f8 = local_4f8 + 8;
      local_4f0 = local_4f0 + 8;
    }
    MFIter::operator++((MFIter *)local_390);
  }
  MFIter::~MFIter((MFIter *)local_390);
  MultiFab::~MultiFab((MultiFab *)local_330);
  MultiFab::~MultiFab((MultiFab *)&local_1b0);
  return this;
}

Assistant:

FabSet&
FabSet::linComb (Real a, const MultiFab& mfa, int a_comp,
                 Real b, const MultiFab& mfb, int b_comp,
                 int dcomp, int ncomp, int ngrow)
{
    BL_PROFILE("FabSet::linComb()");
    BL_ASSERT(ngrow <= mfa.nGrow());
    BL_ASSERT(ngrow <= mfb.nGrow());
    BL_ASSERT(mfa.boxArray() == mfb.boxArray());
    BL_ASSERT(boxArray() != mfa.boxArray());

    MultiFab bdrya(boxArray(),DistributionMap(),ncomp,0,MFInfo(),FArrayBoxFactory());
    MultiFab bdryb(boxArray(),DistributionMap(),ncomp,0,MFInfo(),FArrayBoxFactory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(bdrya); mfi.isValid(); ++mfi) // tiling is not safe for this BoxArray
    {
        const Box& bx = mfi.validbox();
        auto afab = bdrya.array(mfi);
        auto bfab = bdryb.array(mfi);
#ifdef AMREX_USE_FLOAT
        const Real huge = 1.e30f;
#else
        const Real huge = 1.e200;
#endif
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            afab(i,j,k,n) = huge;
            bfab(i,j,k,n) = huge;
        });
    }

    bdrya.ParallelCopy(mfa,a_comp,0,ncomp,ngrow,0);
    bdryb.ParallelCopy(mfb,b_comp,0,ncomp,ngrow,0);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (FabSetIter fsi(*this); fsi.isValid(); ++fsi)
    {
        const Box& bx = fsi.validbox();
        auto const afab = bdrya.array(fsi);
        auto const bfab = bdryb.array(fsi);
        auto       dfab = this->array(fsi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            dfab(i,j,k,n+dcomp) = a*afab(i,j,k,n) + b*bfab(i,j,k,n);
        });
    }

    return *this;
}